

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JacobiSVD.h
# Opt level: O2

void __thiscall
Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::allocate
          (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *this,Index rows,Index cols,
          uint computationOptions)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  Index IVar5;
  
  if ((cols | rows) < 0) {
    __assert_fail("rows >= 0 && cols >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SVD/JacobiSVD.h"
                  ,0x269,
                  "void Eigen::JacobiSVD<Eigen::Matrix<float, 3, 3>, 0>::allocate(Eigen::Index, Eigen::Index, unsigned int) [_MatrixType = Eigen::Matrix<float, 3, 3>, QRPreconditioner = 0]"
                 );
  }
  if (((((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
         m_isAllocated != true) ||
       ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_rows !=
        rows)) ||
      ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_cols !=
       cols)) ||
     ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
      m_computationOptions != computationOptions)) {
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_rows = rows;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_cols = cols;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_info =
         Success;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = false;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isAllocated =
         true;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
    m_computationOptions = computationOptions;
    bVar3 = (byte)computationOptions;
    bVar1 = bVar3 >> 3;
    bVar2 = bVar3 >> 5;
    bVar4 = (bool)(bVar3 >> 2 & 1);
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_computeFullU
         = bVar4;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_computeThinU
         = (bool)(bVar1 & 1);
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_computeFullV
         = (bool)(bVar3 >> 4 & 1);
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_computeThinV
         = (bool)(bVar2 & 1);
    if ((bVar4 != false) && ((bVar1 & 1) != 0)) {
      __assert_fail("!(m_computeFullU && m_computeThinU) && \"JacobiSVD: you can\'t ask for both full and thin U\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SVD/JacobiSVD.h"
                    ,0x27d,
                    "void Eigen::JacobiSVD<Eigen::Matrix<float, 3, 3>, 0>::allocate(Eigen::Index, Eigen::Index, unsigned int) [_MatrixType = Eigen::Matrix<float, 3, 3>, QRPreconditioner = 0]"
                   );
    }
    if (((bVar3 >> 4 & 1) != 0) && ((bVar2 & 1) != 0)) {
      __assert_fail("!(m_computeFullV && m_computeThinV) && \"JacobiSVD: you can\'t ask for both full and thin V\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SVD/JacobiSVD.h"
                    ,0x27e,
                    "void Eigen::JacobiSVD<Eigen::Matrix<float, 3, 3>, 0>::allocate(Eigen::Index, Eigen::Index, unsigned int) [_MatrixType = Eigen::Matrix<float, 3, 3>, QRPreconditioner = 0]"
                   );
    }
    if (((bVar1 & 1) != 0) || ((bVar2 & 1) != 0)) {
      __assert_fail("(!(m_computeThinU || m_computeThinV) || (MatrixType::ColsAtCompileTime==Dynamic)) && \"JacobiSVD: thin U and V are only available when your matrix has a dynamic number of columns.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SVD/JacobiSVD.h"
                    ,0x280,
                    "void Eigen::JacobiSVD<Eigen::Matrix<float, 3, 3>, 0>::allocate(Eigen::Index, Eigen::Index, unsigned int) [_MatrixType = Eigen::Matrix<float, 3, 3>, QRPreconditioner = 0]"
                   );
    }
    IVar5 = rows;
    if (cols < rows) {
      IVar5 = cols;
    }
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_diagSize =
         IVar5;
    PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::resize
              (&(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,IVar5);
    IVar5 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_diagSize;
    PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::resize
              ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
               &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                field_0x8c,IVar5,IVar5);
    if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_rows !=
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_cols) {
      PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::resize
                (&(this->m_scaledMatrix).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                 ,rows,cols);
      return;
    }
  }
  return;
}

Assistant:

void JacobiSVD<MatrixType, QRPreconditioner>::allocate(Eigen::Index rows, Eigen::Index cols, unsigned int computationOptions)
{
  eigen_assert(rows >= 0 && cols >= 0);

  if (m_isAllocated &&
      rows == m_rows &&
      cols == m_cols &&
      computationOptions == m_computationOptions)
  {
    return;
  }

  m_rows = rows;
  m_cols = cols;
  m_info = Success;
  m_isInitialized = false;
  m_isAllocated = true;
  m_computationOptions = computationOptions;
  m_computeFullU = (computationOptions & ComputeFullU) != 0;
  m_computeThinU = (computationOptions & ComputeThinU) != 0;
  m_computeFullV = (computationOptions & ComputeFullV) != 0;
  m_computeThinV = (computationOptions & ComputeThinV) != 0;
  eigen_assert(!(m_computeFullU && m_computeThinU) && "JacobiSVD: you can't ask for both full and thin U");
  eigen_assert(!(m_computeFullV && m_computeThinV) && "JacobiSVD: you can't ask for both full and thin V");
  eigen_assert(EIGEN_IMPLIES(m_computeThinU || m_computeThinV, MatrixType::ColsAtCompileTime==Dynamic) &&
              "JacobiSVD: thin U and V are only available when your matrix has a dynamic number of columns.");
  if (QRPreconditioner == FullPivHouseholderQRPreconditioner)
  {
      eigen_assert(!(m_computeThinU || m_computeThinV) &&
              "JacobiSVD: can't compute thin U or thin V with the FullPivHouseholderQR preconditioner. "
              "Use the ColPivHouseholderQR preconditioner instead.");
  }
  m_diagSize = (std::min)(m_rows, m_cols);
  m_singularValues.resize(m_diagSize);
  if(RowsAtCompileTime==Dynamic)
    m_matrixU.resize(m_rows, m_computeFullU ? m_rows
                            : m_computeThinU ? m_diagSize
                            : 0);
  if(ColsAtCompileTime==Dynamic)
    m_matrixV.resize(m_cols, m_computeFullV ? m_cols
                            : m_computeThinV ? m_diagSize
                            : 0);
  m_workMatrix.resize(m_diagSize, m_diagSize);
  
  if(m_cols>m_rows)   m_qr_precond_morecols.allocate(*this);
  if(m_rows>m_cols)   m_qr_precond_morerows.allocate(*this);
  if(m_rows!=m_cols)  m_scaledMatrix.resize(rows,cols);
}